

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_constructors_initialiser_lists_Test::TestBody
          (test_matrix_sparse_constructors_initialiser_lists_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<double> value_01;
  initializer_list<double> value_02;
  initializer_list<double> value_03;
  initializer_list<double> value_04;
  initializer_list<double> value_05;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> non_zero_00;
  initializer_list<unsigned_long> index_01;
  initializer_list<unsigned_long> non_zero_01;
  initializer_list<unsigned_long> index_02;
  initializer_list<unsigned_long> non_zero_02;
  initializer_list<unsigned_long> index_03;
  initializer_list<unsigned_long> non_zero_03;
  initializer_list<unsigned_long> index_04;
  initializer_list<unsigned_long> non_zero_04;
  initializer_list<unsigned_long> index_05;
  initializer_list<unsigned_long> non_zero_05;
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Scalar *pSVar5;
  char *regex;
  char *regex_00;
  char *regex_01;
  char *regex_02;
  char *regex_03;
  char *regex_04;
  AssertHelper local_b30;
  Message local_b28 [6];
  exception *gtest_exception_5;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  exception **local_ad8;
  undefined8 uStack_ad0;
  unsigned_long local_ac8 [4];
  iterator local_aa8;
  undefined8 local_aa0;
  unsigned_long local_a98 [3];
  iterator local_a80;
  undefined8 local_a78;
  Matrix_Sparse local_a70;
  ReturnSentinel local_a20;
  ReturnSentinel gtest_sentinel_5;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_5;
  pointer local_9f8;
  DeathTest *gtest_dt_5;
  Message local_9e8 [6];
  exception *gtest_exception_4;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  exception **local_998;
  undefined8 uStack_990;
  unsigned_long local_988 [4];
  iterator local_968;
  undefined8 local_960;
  unsigned_long local_958 [3];
  iterator local_940;
  undefined8 local_938;
  Matrix_Sparse local_930;
  ReturnSentinel local_8e0;
  ReturnSentinel gtest_sentinel_4;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_4;
  pointer local_8b8;
  DeathTest *gtest_dt_4;
  Message local_8a8 [6];
  exception *gtest_exception_3;
  undefined8 uStack_870;
  undefined8 local_868;
  exception **local_858;
  undefined8 uStack_850;
  unsigned_long local_848 [4];
  iterator local_828;
  undefined8 local_820;
  unsigned_long local_818 [3];
  iterator local_800;
  undefined8 local_7f8;
  Matrix_Sparse local_7f0;
  ReturnSentinel local_7a0;
  ReturnSentinel gtest_sentinel_3;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_3;
  pointer local_778;
  DeathTest *gtest_dt_3;
  Message local_768 [6];
  exception *gtest_exception_2;
  undefined8 uStack_730;
  undefined8 local_728;
  exception **local_718;
  undefined8 uStack_710;
  unsigned_long local_708 [4];
  iterator local_6e8;
  undefined8 local_6e0;
  unsigned_long local_6d8 [3];
  iterator local_6c0;
  undefined8 local_6b8;
  Matrix_Sparse local_6b0;
  ReturnSentinel local_660;
  ReturnSentinel gtest_sentinel_2;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_2;
  pointer local_638;
  DeathTest *gtest_dt_2;
  Message local_628 [6];
  exception *gtest_exception_1;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  exception **local_5d8;
  undefined8 uStack_5d0;
  unsigned_long local_5c8 [4];
  iterator local_5a8;
  undefined8 local_5a0;
  unsigned_long local_598 [4];
  iterator local_578;
  undefined8 local_570;
  Matrix_Sparse local_568;
  ReturnSentinel local_518;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_4f0;
  DeathTest *gtest_dt_1;
  Message local_4e0;
  int local_4d4;
  exception *gtest_exception;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  exception **local_488;
  undefined8 uStack_480;
  unsigned_long local_478 [4];
  iterator local_458;
  undefined8 local_450;
  unsigned_long local_448 [4];
  iterator local_428;
  undefined8 local_420;
  Matrix_Sparse local_418;
  ReturnSentinel local_3c8;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_3a0;
  DeathTest *gtest_dt;
  Message local_390;
  size_t local_388 [2];
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  AssertionResult gtest_ar_9;
  Message local_350;
  pointer local_348;
  pointer local_340;
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  AssertionResult gtest_ar_8;
  Message local_310;
  pointer local_308;
  pointer local_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_7;
  Message local_2d0;
  pointer local_2c8;
  pointer local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_6;
  Message local_290;
  pointer local_288;
  pointer local_280;
  undefined1 local_278 [16];
  undefined1 local_268 [8];
  AssertionResult gtest_ar_5;
  Message local_250;
  pointer local_248;
  pointer local_240;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  AssertionResult gtest_ar_4;
  Message local_210;
  pointer local_208;
  pointer local_200;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_3;
  Message local_1d0;
  int local_1c4;
  pointer local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_2;
  Message local_1a0;
  int local_194;
  size_t local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_1;
  Message local_170 [3];
  int local_154;
  size_t local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  unsigned_long local_e8 [8];
  iterator local_a8;
  undefined8 local_a0;
  unsigned_long local_98 [5];
  iterator local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  Matrix_Sparse matrix;
  test_matrix_sparse_constructors_initialiser_lists_Test *this_local;
  
  local_98[2] = 5;
  local_98[3] = 5;
  local_98[0] = 0;
  local_98[1] = 2;
  local_98[4] = 7;
  local_70 = local_98;
  local_68 = 5;
  local_e8[4] = 3;
  local_e8[5] = 4;
  local_e8[2] = 2;
  local_e8[3] = 0;
  local_e8[0] = 1;
  local_e8[1] = 3;
  local_e8[6] = 3;
  local_a8 = local_e8;
  local_a0 = 7;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3ff0000000000000;
  non_zero_05._M_len = 5;
  non_zero_05._M_array = local_70;
  index_05._M_len = 7;
  index_05._M_array = local_a8;
  value._M_len = 7;
  value._M_array = (iterator)&gtest_ar.message_;
  matrix.column_size = (size_t)this;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_60,non_zero_05,index_05,value,5);
  local_150 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_154 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_148,"matrix.size_row()","4",&local_150,&local_154);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(local_170);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x29,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_190 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_194 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_188,"matrix.size_column()","5",&local_190,&local_194);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1c0 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_1c4 = 7;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1b8,"matrix.size_non_zero()","7",(unsigned_long *)&local_1c0,
             &local_1c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  local_200 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1f8,(size_t *)local_60);
  local_208 = (pointer)0x1;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1f8,(size_t *)&local_208);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1e8,"matrix[0][1]","1.0",*pSVar5,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  local_240 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_238,(size_t *)local_60);
  local_248 = (pointer)0x3;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_238,(size_t *)&local_248);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_228,"matrix[0][3]","2.0",*pSVar5,2.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_280 = (pointer)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_278,(size_t *)local_60);
  local_288 = (pointer)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_278,(size_t *)&local_288);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_268,"matrix[1][0]","4.0",*pSVar5,4.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  local_2c0 = (pointer)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2b8,(size_t *)local_60);
  local_2c8 = (pointer)0x2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2b8,(size_t *)&local_2c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2a8,"matrix[1][2]","3.0",*pSVar5,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  local_300 = (pointer)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2f8,(size_t *)local_60);
  local_308 = (pointer)0x3;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2f8,(size_t *)&local_308);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2e8,"matrix[1][3]","5.0",*pSVar5,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x30,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  local_340 = (pointer)0x3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_338,(size_t *)local_60);
  local_348 = (pointer)0x3;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_338,(size_t *)&local_348);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_328,"matrix[3][3]","7.0",*pSVar5,7.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x31,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  local_388[1] = 3;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_378,(size_t *)local_60);
  local_388[0] = 4;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_378,local_388);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_368,"matrix[3][4]","6.0",*pSVar5,6.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x32,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)".*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({0, 2, 3}, {1, 0, 0, 1}, {1.0, 2.0, 3.0, 4.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x36,&local_3a0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00113a61;
    if (local_3a0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_3a0);
      iVar2 = (*local_3a0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_3a0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_3a0->_vptr_DeathTest[4])(local_3a0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00113a23;
        local_4d4 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_3c8,local_3a0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_448[0] = 0;
            local_448[1] = 2;
            local_448[2] = 3;
            local_428 = local_448;
            local_420 = 3;
            local_478[2] = 0;
            local_478[3] = 1;
            local_478[0] = 1;
            local_478[1] = 0;
            local_458 = local_478;
            local_450 = 4;
            local_498 = 0x4008000000000000;
            uStack_490 = 0x4010000000000000;
            gtest_exception = (exception *)0x3ff0000000000000;
            uStack_4a0 = 0x4000000000000000;
            local_488 = &gtest_exception;
            uStack_480 = 4;
            non_zero_04._M_len = 3;
            non_zero_04._M_array = local_428;
            index_04._M_len = 4;
            index_04._M_array = local_458;
            value_00._M_len = 4;
            value_00._M_array = (iterator)local_488;
            Disa::Matrix_Sparse::Matrix_Sparse(&local_418,non_zero_04,index_04,value_00,2);
            Disa::Matrix_Sparse::~Matrix_Sparse(&local_418);
          }
          (*local_3a0->_vptr_DeathTest[5])(local_3a0,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_3c8);
        }
LAB_00113a23:
        local_4d4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_4d4 != 0) goto LAB_00113a61;
    }
  }
  else {
LAB_00113a61:
    testing::Message::Message(&local_4e0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x36,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_4e0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)".*",regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0, 4.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x37,&local_4f0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00113fa1;
    if (local_4f0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_4f0);
      iVar2 = (*local_4f0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_4f0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_4f0->_vptr_DeathTest[4])(local_4f0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00113f63;
        local_4d4 = 4;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_518,local_4f0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_598[0] = 0;
            local_598[1] = 2;
            local_598[2] = 3;
            local_578 = local_598;
            local_570 = 3;
            local_5c8[0] = 1;
            local_5c8[1] = 0;
            local_5c8[2] = 0;
            local_5a8 = local_5c8;
            local_5a0 = 3;
            local_5e8 = 0x4008000000000000;
            uStack_5e0 = 0x4010000000000000;
            gtest_exception_1 = (exception *)0x3ff0000000000000;
            uStack_5f0 = 0x4000000000000000;
            local_5d8 = &gtest_exception_1;
            uStack_5d0 = 4;
            non_zero_03._M_len = 3;
            non_zero_03._M_array = local_578;
            index_03._M_len = 3;
            index_03._M_array = local_5a8;
            value_01._M_len = 4;
            value_01._M_array = (iterator)local_5d8;
            Disa::Matrix_Sparse::Matrix_Sparse(&local_568,non_zero_03,index_03,value_01,2);
            Disa::Matrix_Sparse::~Matrix_Sparse(&local_568);
          }
          (*local_4f0->_vptr_DeathTest[5])(local_4f0,2);
          local_4d4 = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_518);
        }
LAB_00113f63:
        local_4d4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_4d4 != 0) goto LAB_00113fa1;
    }
  }
  else {
LAB_00113fa1:
    testing::Message::Message(local_628);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x37,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_2,local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_2);
    testing::Message::~Message(local_628);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2,(internal *)".*",regex_01);
    bVar1 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({1, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x38,&local_638);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_001144e4;
    if (local_638 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_2,local_638);
      iVar2 = (*local_638->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_638->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_638->_vptr_DeathTest[4])(local_638,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_001144a6;
        local_4d4 = 6;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_660,local_638);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_6d8[0] = 1;
            local_6d8[1] = 2;
            local_6d8[2] = 3;
            local_6c0 = local_6d8;
            local_6b8 = 3;
            local_708[0] = 1;
            local_708[1] = 0;
            local_708[2] = 0;
            local_6e8 = local_708;
            local_6e0 = 3;
            local_728 = 0x4008000000000000;
            gtest_exception_2 = (exception *)0x3ff0000000000000;
            uStack_730 = 0x4000000000000000;
            local_718 = &gtest_exception_2;
            uStack_710 = 3;
            non_zero_02._M_len = 3;
            non_zero_02._M_array = local_6c0;
            index_02._M_len = 3;
            index_02._M_array = local_6e8;
            value_02._M_len = 3;
            value_02._M_array = (iterator)local_718;
            Disa::Matrix_Sparse::Matrix_Sparse(&local_6b0,non_zero_02,index_02,value_02,2);
            Disa::Matrix_Sparse::~Matrix_Sparse(&local_6b0);
          }
          (*local_638->_vptr_DeathTest[5])(local_638,2);
          local_4d4 = 7;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_660);
        }
LAB_001144a6:
        local_4d4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_2);
      if (local_4d4 != 0) goto LAB_001144e4;
    }
  }
  else {
LAB_001144e4:
    testing::Message::Message(local_768);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x38,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_3,local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_3);
    testing::Message::~Message(local_768);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3,(internal *)".*",regex_02);
    bVar1 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({2, 0, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x39,&local_778);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00114a27;
    if (local_778 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_3,local_778);
      iVar2 = (*local_778->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_778->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_778->_vptr_DeathTest[4])(local_778,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_001149e9;
        local_4d4 = 8;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_7a0,local_778);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_818[0] = 2;
            local_818[1] = 0;
            local_818[2] = 3;
            local_800 = local_818;
            local_7f8 = 3;
            local_848[0] = 1;
            local_848[1] = 0;
            local_848[2] = 0;
            local_828 = local_848;
            local_820 = 3;
            local_868 = 0x4008000000000000;
            gtest_exception_3 = (exception *)0x3ff0000000000000;
            uStack_870 = 0x4000000000000000;
            local_858 = &gtest_exception_3;
            uStack_850 = 3;
            non_zero_01._M_len = 3;
            non_zero_01._M_array = local_800;
            index_01._M_len = 3;
            index_01._M_array = local_828;
            value_03._M_len = 3;
            value_03._M_array = (iterator)local_858;
            Disa::Matrix_Sparse::Matrix_Sparse(&local_7f0,non_zero_01,index_01,value_03,2);
            Disa::Matrix_Sparse::~Matrix_Sparse(&local_7f0);
          }
          (*local_778->_vptr_DeathTest[5])(local_778,2);
          local_4d4 = 9;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_7a0);
        }
LAB_001149e9:
        local_4d4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_3);
      if (local_4d4 != 0) goto LAB_00114a27;
    }
  }
  else {
LAB_00114a27:
    testing::Message::Message(local_8a8);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x39,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_4,local_8a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_4);
    testing::Message::~Message(local_8a8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_4,(internal *)".*",regex_03);
    bVar1 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({0, 2, 3}, {1, 0, 2}, {1.0, 2.0, 3.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x3a,&local_8b8);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_4);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00114f6a;
    if (local_8b8 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_4,local_8b8);
      iVar2 = (*local_8b8->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_8b8->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_8b8->_vptr_DeathTest[4])(local_8b8,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00114f2c;
        local_4d4 = 10;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_8e0,local_8b8);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_958[0] = 0;
            local_958[1] = 2;
            local_958[2] = 3;
            local_940 = local_958;
            local_938 = 3;
            local_988[0] = 1;
            local_988[1] = 0;
            local_988[2] = 2;
            local_968 = local_988;
            local_960 = 3;
            local_9a8 = 0x4008000000000000;
            gtest_exception_4 = (exception *)0x3ff0000000000000;
            uStack_9b0 = 0x4000000000000000;
            local_998 = &gtest_exception_4;
            uStack_990 = 3;
            non_zero_00._M_len = 3;
            non_zero_00._M_array = local_940;
            index_00._M_len = 3;
            index_00._M_array = local_968;
            value_04._M_len = 3;
            value_04._M_array = (iterator)local_998;
            Disa::Matrix_Sparse::Matrix_Sparse(&local_930,non_zero_00,index_00,value_04,2);
            Disa::Matrix_Sparse::~Matrix_Sparse(&local_930);
          }
          (*local_8b8->_vptr_DeathTest[5])(local_8b8,2);
          local_4d4 = 0xb;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_8e0);
        }
LAB_00114f2c:
        local_4d4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_4);
      if (local_4d4 != 0) goto LAB_00114f6a;
    }
  }
  else {
LAB_00114f6a:
    testing::Message::Message(local_9e8);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x3a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_5,local_9e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_5);
    testing::Message::~Message(local_9e8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_5,(internal *)".*",regex_04);
    bVar1 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({0, 2, 3}, {1, 1, 0}, {1.0, 2.0, 3.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x3b,&local_9f8);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_5);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_9f8 == (pointer)0x0) goto LAB_0011555e;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_5,local_9f8);
      iVar2 = (*local_9f8->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_9f8->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_9f8->_vptr_DeathTest[4])(local_9f8,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0011546f;
        local_4d4 = 0xc;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_a20,local_9f8);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_a98[0] = 0;
            local_a98[1] = 2;
            local_a98[2] = 3;
            local_a80 = local_a98;
            local_a78 = 3;
            local_ac8[0] = 1;
            local_ac8[1] = 1;
            local_ac8[2] = 0;
            local_aa8 = local_ac8;
            local_aa0 = 3;
            local_ae8 = 0x4008000000000000;
            gtest_exception_5 = (exception *)0x3ff0000000000000;
            uStack_af0 = 0x4000000000000000;
            local_ad8 = &gtest_exception_5;
            uStack_ad0 = 3;
            non_zero._M_len = 3;
            non_zero._M_array = local_a80;
            index._M_len = 3;
            index._M_array = local_aa8;
            value_05._M_len = 3;
            value_05._M_array = (iterator)local_ad8;
            Disa::Matrix_Sparse::Matrix_Sparse(&local_a70,non_zero,index,value_05,2);
            Disa::Matrix_Sparse::~Matrix_Sparse(&local_a70);
          }
          (*local_9f8->_vptr_DeathTest[5])(local_9f8,2);
          local_4d4 = 0xd;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_a20);
        }
LAB_0011546f:
        local_4d4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_5);
      if (local_4d4 == 0) goto LAB_0011555e;
    }
  }
  testing::Message::Message(local_b28);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_b30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
             ,0x3b,pcVar4);
  testing::internal::AssertHelper::operator=(&local_b30,local_b28);
  testing::internal::AssertHelper::~AssertHelper(&local_b30);
  testing::Message::~Message(local_b28);
LAB_0011555e:
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_60);
  return;
}

Assistant:

TEST(test_matrix_sparse, constructors_initialiser_lists) {
  Matrix_Sparse matrix({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  EXPECT_EQ(matrix.size_row(), 4);
  EXPECT_EQ(matrix.size_column(), 5);
  EXPECT_EQ(matrix.size_non_zero(), 7);
  EXPECT_DOUBLE_EQ(matrix[0][1], 1.0);
  EXPECT_DOUBLE_EQ(matrix[0][3], 2.0);
  EXPECT_DOUBLE_EQ(matrix[1][0], 4.0);
  EXPECT_DOUBLE_EQ(matrix[1][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix[1][3], 5.0);
  EXPECT_DOUBLE_EQ(matrix[3][3], 7.0);
  EXPECT_DOUBLE_EQ(matrix[3][4], 6.0);

  // Valid construction 2x2: Matrix_Sparse({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2)
  EXPECT_DEATH(Matrix_Sparse({0, 2, 3}, {1, 0, 0, 1}, {1.0, 2.0, 3.0, 4.0}, 2),
               ".*");  // more column indexes than non-zero.back().
  EXPECT_DEATH(Matrix_Sparse({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0, 4.0}, 2), ".*");  // mismatch column and entry size.
  EXPECT_DEATH(Matrix_Sparse({1, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2), ".*");       // first non-zero value is not 0.
  EXPECT_DEATH(Matrix_Sparse({2, 0, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2), ".*");       // un-ordered non-zeros
  EXPECT_DEATH(Matrix_Sparse({0, 2, 3}, {1, 0, 2}, {1.0, 2.0, 3.0}, 2), ".*");       // column index out of range
  EXPECT_DEATH(Matrix_Sparse({0, 2, 3}, {1, 1, 0}, {1.0, 2.0, 3.0}, 2), ".*");       // repeated column index
}